

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

bool __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::checkTransformFeedbackBuffer
          (CaptureVertexInterleaved *this,BindBufferCase bind_case,GLenum primitive_type)

{
  RenderContext *pRVar1;
  ulong uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  undefined4 *puVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined4 in_register_00000034;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar5;
  
  pRVar1 = this->m_context->m_renderCtx;
  iVar3 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,CONCAT44(in_register_00000034,bind_case));
  lVar5 = CONCAT44(extraout_var,iVar3);
  if (6 < primitive_type) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  uVar2 = *(ulong *)(&DAT_01a01ef8 + (ulong)primitive_type * 8);
  lVar6 = (**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xa89);
  iVar3 = this->m_max_transform_feedback_components;
  iVar10 = 0;
  uVar11 = 0;
  bVar9 = true;
  do {
    if ((uVar2 <= uVar11) || (bVar9 == false)) goto LAB_00861dd0;
    bVar8 = bVar9;
    if (0 < (int)(iVar3 - 4U)) {
      uVar13 = 0;
      do {
        if (0.125 < ABS(*(float *)(lVar6 + (ulong)(uint)(iVar10 + (int)uVar13) * 4) -
                        (float)(int)uVar13)) {
          bVar8 = false;
          break;
        }
        uVar13 = uVar13 + 1;
      } while (iVar3 - 4U != uVar13);
    }
    uVar11 = uVar11 + 1;
    iVar12 = iVar3 * (int)uVar11;
    if (0.125 < ABS(ABS(*(float *)(lVar6 + (ulong)(iVar12 - 4) * 4)) + -1.0 + 0.0625)) break;
    bVar9 = false;
    if ((0.125 < ABS(ABS(*(float *)(lVar6 + (ulong)(iVar12 - 3) * 4)) + -1.0 + 0.0625)) ||
       (0.125 < ABS(*(float *)(lVar6 + (ulong)(iVar12 - 2) * 4)))) goto LAB_00861dd0;
    iVar10 = iVar10 + iVar3;
    bVar9 = bVar8;
  } while (ABS(*(float *)(lVar6 + (ulong)(iVar12 - 1) * 4) + -1.0) <= 0.125);
  bVar9 = false;
LAB_00861dd0:
  (**(code **)(lVar5 + 0x1670))(0x8c8e);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xaad);
  return bVar9;
}

Assistant:

bool gl3cts::TransformFeedback::CaptureVertexInterleaved::checkTransformFeedbackBuffer(BindBufferCase bind_case UNUSED,
																					   glw::GLenum primitive_type)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check */
	glw::GLuint number_of_vertices = 0;

	switch (primitive_type)
	{
	case GL_POINTS:
		number_of_vertices = 4;
		break;
	case GL_LINES:
		number_of_vertices = 4;
		break;
	case GL_LINE_LOOP:
		number_of_vertices = 8;
		break;
	case GL_LINE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLES:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_FAN:
		number_of_vertices = 6;
		break;
	default:
		throw 0;
	}

	glw::GLfloat* results = (glw::GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	bool is_ok = true;

	for (glw::GLuint j = 0; (j < number_of_vertices) && is_ok; ++j)
	{
		for (glw::GLint i = 0; i < m_max_transform_feedback_components - 4; ++i)
		{
			glw::GLfloat result	= results[i + j * m_max_transform_feedback_components];
			glw::GLfloat reference = (glw::GLfloat)(i);

			if (fabs(result - reference) > 0.125 /* precision */)
			{
				is_ok = false;

				break;
			}
		}

		/* gl_Position */
		glw::GLfloat result[4] = { results[(j + 1) * m_max_transform_feedback_components - 4],
								   results[(j + 1) * m_max_transform_feedback_components - 3],
								   results[(j + 1) * m_max_transform_feedback_components - 2],
								   results[(j + 1) * m_max_transform_feedback_components - 1] };

		if ((fabs(fabs(result[0]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
			(fabs(fabs(result[1]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
			(fabs(result[2]) > 0.125 /* precision */) || (fabs(result[3] - 1.0) > 0.125 /* precision */))
		{
			is_ok = false;

			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	return is_ok;
}